

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs.c
# Opt level: O2

Qiniu_Error
Qiniu_RS_BatchChangeType
          (Qiniu_Client *self,Qiniu_RS_BatchItemRet *rets,Qiniu_RS_EntryChangeType *entries,
          Qiniu_ItemCount entryCount)

{
  uint uVar1;
  char *pcVar2;
  char *s1;
  char *s2;
  char *s3;
  size_t bodyLen;
  cJSON *pcVar3;
  Qiniu_Int64 QVar4;
  char *pcVar5;
  ulong uVar6;
  cJSON **__s;
  ulong uVar7;
  int *piVar8;
  long lVar9;
  Qiniu_Error QVar10;
  Qiniu_Error QVar11;
  cJSON *root;
  char *local_50;
  Qiniu_Client *local_48;
  Qiniu_RS_BatchItemRet *local_40;
  char *rsHost;
  
  local_40 = rets;
  QVar10 = _Qiniu_Region_Get_Rs_Host(self,(char *)0x0,entries->bucket,&rsHost);
  if (QVar10.code == 200) {
    local_48 = self;
    local_50 = Qiniu_String_Concat2(rsHost,"/batch");
    if (entryCount < 1) {
      entryCount = 0;
    }
    pcVar5 = (char *)0x0;
    for (lVar9 = 0; (ulong)(uint)entryCount * 0x18 != lVar9; lVar9 = lVar9 + 0x18) {
      pcVar2 = Qiniu_String_Concat3
                         (*(char **)((long)&entries->bucket + lVar9),":",
                          *(char **)((long)&entries->key + lVar9));
      s1 = Qiniu_String_Encode(pcVar2);
      root._0_4_ = 0;
      uVar6 = (ulong)*(uint *)((long)&entries->fileType + lVar9);
      if (uVar6 < 5) {
        __s = *(cJSON ***)(&DAT_0016eeb0 + uVar6 * 8);
      }
      else {
        __s = &root;
        snprintf((char *)__s,4,"%d");
      }
      s2 = Qiniu_String_Concat(s1,"/type/",__s,0);
      s3 = Qiniu_String_Concat2("op=/chtype/",s2);
      Qiniu_Free(pcVar2);
      Qiniu_Free(s1);
      Qiniu_Free(s2);
      pcVar2 = s3;
      if (pcVar5 != (char *)0x0) {
        pcVar2 = Qiniu_String_Concat3(pcVar5,"&",s3);
        free(s3);
      }
      free(pcVar5);
      pcVar5 = pcVar2;
    }
    bodyLen = strlen(pcVar5);
    pcVar2 = local_50;
    QVar11 = Qiniu_Client_CallWithBuffer
                       (local_48,&root,local_50,pcVar5,bodyLen,"application/x-www-form-urlencoded");
    free(pcVar2);
    free(pcVar5);
    uVar1 = cJSON_GetArraySize((cJSON *)CONCAT44(root._4_4_,root._0_4_));
    uVar7 = 0;
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar6 = uVar7;
    }
    piVar8 = &local_40->code;
    for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      pcVar3 = cJSON_GetArrayItem((cJSON *)CONCAT44(root._4_4_,root._0_4_),(int)uVar7);
      QVar4 = Qiniu_Json_GetInt64(pcVar3,"code",0);
      pcVar3 = cJSON_GetObjectItem(pcVar3,"data");
      *piVar8 = (int)QVar4;
      if ((int)QVar4 != 200) {
        pcVar5 = Qiniu_Json_GetString(pcVar3,"error",(char *)0x0);
        ((Qiniu_RS_BatchItemRet *)(piVar8 + -2))->error = pcVar5;
      }
      piVar8 = piVar8 + 4;
    }
    QVar10._4_4_ = 0;
    QVar10.code = QVar11.code;
    QVar10.message = QVar11.message;
  }
  return QVar10;
}

Assistant:

Qiniu_Error Qiniu_RS_BatchChangeType(Qiniu_Client *self, Qiniu_RS_BatchItemRet *rets,
                                     Qiniu_RS_EntryChangeType *entries, Qiniu_ItemCount entryCount)
{
    int code;
    Qiniu_Error err;
    cJSON *root, *arrayItem, *dataItem;
    char *body = NULL, *bodyTmp = NULL;
    char *entryURI, *entryURIEncoded, *opBody, *bodyPart;

    Qiniu_ItemCount curr = 0;
    Qiniu_ItemCount retSize = 0;
    Qiniu_RS_EntryChangeType *entry = entries;
    const char *rsHost;

    err = _Qiniu_Region_Get_Rs_Host(self, NULL, entry->bucket, &rsHost);
    if (err.code != 200)
    {
        return err;
    }

    char *url = Qiniu_String_Concat2(rsHost, "/batch");

    curr = 0;
    while (curr < entryCount)
    {
        entryURI = Qiniu_String_Concat3(entry->bucket, ":", entry->key);
        entryURIEncoded = Qiniu_String_Encode(entryURI);

        char *fileType = NULL, buf[4] = {0};
        switch (entry->fileType)
        {
        case QINIU_FILE_TYPE_STANDARD:
            fileType = "0";
            break;
        case QINIU_FILE_TYPE_IA:
            fileType = "1";
            break;
        case QINIU_FILE_TYPE_ARCHIVE:
            fileType = "2";
            break;
        case QINIU_FILE_TYPE_DEEP_ARCHIVE:
            fileType = "3";
            break;
        case QINIU_FILE_TYPE_ARCHIVE_IR:
            fileType = "4";
            break;
        default:
            snprintf(buf, sizeof(buf), "%d", entry->fileType);
            fileType = &buf[0];
            break;
        }

        bodyPart = Qiniu_String_Concat(entryURIEncoded, "/type/", fileType, NULL);
        opBody = Qiniu_String_Concat2("op=/chtype/", bodyPart);
        Qiniu_Free(entryURI);
        Qiniu_Free(entryURIEncoded);
        Qiniu_Free(bodyPart);

        if (!body)
        {
            bodyTmp = opBody;
        }
        else
        {
            bodyTmp = Qiniu_String_Concat3(body, "&", opBody);
            free(opBody);
        }
        free(body);
        body = bodyTmp;
        curr++;
        entry = &entries[curr];
    }

    err = Qiniu_Client_CallWithBuffer(self, &root,
                                      url, body, strlen(body), "application/x-www-form-urlencoded");
    free(url);
    free(body);

    retSize = cJSON_GetArraySize(root);

    curr = 0;
    while (curr < retSize)
    {
        arrayItem = cJSON_GetArrayItem(root, curr);
        code = (int)Qiniu_Json_GetInt64(arrayItem, "code", 0);
        dataItem = cJSON_GetObjectItem(arrayItem, "data");

        rets[curr].code = code;

        if (code != 200)
        {
            rets[curr].error = Qiniu_Json_GetString(dataItem, "error", 0);
        }
        curr++;
    }

    return err;
}